

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O0

TrackData * GenerateEmptyTrack(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  bool bVar1;
  BitBuffer *bitstream;
  undefined1 local_a0 [8];
  BitstreamTrackBuilder bitbuf;
  Track *track_local;
  CylHead *cylhead_local;
  
  bitbuf.m_buffer._96_8_ = track;
  bVar1 = IsEmptyTrack(track);
  if (!bVar1) {
    __assert_fail("IsEmptyTrack(track)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                  ,0x15,"TrackData GenerateEmptyTrack(const CylHead &, const Track &)");
  }
  BitstreamTrackBuilder::BitstreamTrackBuilder((BitstreamTrackBuilder *)local_a0,_250K,MFM);
  TrackBuilder::addBlock((TrackBuilder *)local_a0,0x4e,0x186a);
  bitstream = BitstreamTrackBuilder::buffer((BitstreamTrackBuilder *)local_a0);
  TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
  BitstreamTrackBuilder::~BitstreamTrackBuilder((BitstreamTrackBuilder *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

TrackData GenerateEmptyTrack(const CylHead& cylhead, const Track& track)
{
    assert(IsEmptyTrack(track));
    (void)track;

    // Generate a DD track full of gap filler. It shouldn't really matter
    // which datarate and encoding as long as there are no sync marks.
    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addBlock(0x4e, 6250);

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}